

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::InsertTypeTransitionAfterInstr
          (BackwardPass *this,Instr *instr,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  bool bVar1;
  JITTypeHolder type;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses_local;
  AddPropertyCacheBucket *data_local;
  int symId_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar1 = IsPrePass(this);
  if (!bVar1) {
    bVar1 = IR::Instr::EndsBasicBlock(instr);
    if (bVar1) {
      InsertTypeTransitionsAtPriorSuccessors
                (this,this->currentBlock,(BasicBlock *)0x0,symId,data,upwardExposedUses);
    }
    else {
      InsertTypeTransition(this,instr->m_next,symId,data,upwardExposedUses);
    }
  }
  type = AddPropertyCacheBucket::GetInitialType(data);
  AddPropertyCacheBucket::SetFinalType(data,type);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionAfterInstr(IR::Instr *instr, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    if (!this->IsPrePass())
    {
        // Transition to the final type if we don't bail out.
        if (instr->EndsBasicBlock())
        {
            // The instr with the bailout is something like a branch that may not fall through.
            // Insert the transitions instead at the beginning of each successor block.
            this->InsertTypeTransitionsAtPriorSuccessors(this->currentBlock, nullptr, symId, data, upwardExposedUses);
        }
        else
        {
            this->InsertTypeTransition(instr->m_next, symId, data, upwardExposedUses);
        }
    }
    // Note: we could probably clear this entry out of the table, but I don't know
    // whether it's worth it, because it's likely coming right back.
    data->SetFinalType(data->GetInitialType());
}